

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::FileExists(string *filename,bool isFile)

{
  bool bVar1;
  undefined1 local_1a;
  bool isFile_local;
  string *filename_local;
  
  bVar1 = FileExists(filename);
  if (bVar1) {
    local_1a = 1;
    if (isFile) {
      bVar1 = FileIsDirectory(filename);
      local_1a = bVar1 ^ 0xff;
    }
    filename_local._7_1_ = (bool)(local_1a & 1);
  }
  else {
    filename_local._7_1_ = false;
  }
  return filename_local._7_1_;
}

Assistant:

bool SystemTools::FileExists(const std::string& filename, bool isFile)
{
  if(SystemTools::FileExists(filename))
    {
    // If isFile is set return not FileIsDirectory,
    // so this will only be true if it is a file
    return !isFile || !SystemTools::FileIsDirectory(filename);
    }
  return false;
}